

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGLinearGradientElement::SVGLinearGradientElement
          (SVGLinearGradientElement *this,Document *document)

{
  SVGGradientElement::SVGGradientElement(&this->super_SVGGradientElement,document,LinearGradient);
  (this->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGLinearGradientElement_0015a148;
  SVGProperty::SVGProperty(&(this->m_x1).super_SVGProperty,X1);
  (this->m_x1).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_x1).super_SVGProperty.field_0x9 = 0;
  *(undefined4 *)&(this->m_x1).super_SVGProperty.field_0xc = 0;
  (this->m_x1).field_0x10 = 1;
  SVGProperty::SVGProperty(&(this->m_y1).super_SVGProperty,Y1);
  (this->m_y1).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_y1).super_SVGProperty.field_0x9 = 1;
  *(undefined4 *)&(this->m_y1).super_SVGProperty.field_0xc = 0;
  (this->m_y1).field_0x10 = 1;
  SVGProperty::SVGProperty(&(this->m_x2).super_SVGProperty,X2);
  (this->m_x2).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_x2).super_SVGProperty.field_0x9 = 0;
  *(undefined4 *)&(this->m_x2).super_SVGProperty.field_0xc = 0x42c80000;
  (this->m_x2).field_0x10 = 1;
  SVGProperty::SVGProperty(&(this->m_y2).super_SVGProperty,Y2);
  (this->m_y2).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_y2).super_SVGProperty.field_0x9 = 1;
  *(undefined4 *)&(this->m_y2).super_SVGProperty.field_0xc = 0;
  (this->m_y2).field_0x10 = 1;
  SVGElement::addProperty((SVGElement *)this,&(this->m_x1).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y1).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_x2).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y2).super_SVGProperty);
  return;
}

Assistant:

SVGLinearGradientElement::SVGLinearGradientElement(Document* document)
    : SVGGradientElement(document, ElementID::LinearGradient)
    , m_x1(PropertyID::X1, LengthDirection::Horizontal, LengthNegativeMode::Allow, 0.f, LengthUnits::Percent)
    , m_y1(PropertyID::Y1, LengthDirection::Vertical, LengthNegativeMode::Allow, 0.f, LengthUnits::Percent)
    , m_x2(PropertyID::X2, LengthDirection::Horizontal, LengthNegativeMode::Allow, 100.f, LengthUnits::Percent)
    , m_y2(PropertyID::Y2, LengthDirection::Vertical, LengthNegativeMode::Allow, 0.f, LengthUnits::Percent)
{
    addProperty(m_x1);
    addProperty(m_y1);
    addProperty(m_x2);
    addProperty(m_y2);
}